

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lha_end_of_entry(archive_read *a)

{
  void *pvVar1;
  wchar_t wVar2;
  
  pvVar1 = a->format->data;
  wVar2 = L'\x01';
  if (*(char *)((long)pvVar1 + 0x125) == '\0') {
    wVar2 = L'\x01';
    if (((*(byte *)((long)pvVar1 + 0x40) & 8) != 0) &&
       (*(short *)((long)pvVar1 + 0xba) != *(short *)((long)pvVar1 + 0x18))) {
      archive_set_error(&a->archive,-1,"LHa data CRC error");
      wVar2 = L'\xffffffec';
    }
    *(undefined1 *)((long)pvVar1 + 0x125) = 1;
  }
  return wVar2;
}

Assistant:

static int
lha_end_of_entry(struct archive_read *a)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r = ARCHIVE_EOF;

	if (!lha->end_of_entry_cleanup) {
		if ((lha->setflag & CRC_IS_SET) &&
		    lha->crc != lha->entry_crc_calculated) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "LHa data CRC error");
			r = ARCHIVE_WARN;
		}

		/* End-of-entry cleanup done. */
		lha->end_of_entry_cleanup = 1;
	}
	return (r);
}